

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O2

void Rwt_Man5ExplorePrint(void)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  int iVar3;
  uint uVar4;
  stmm_generator *psVar5;
  void *__ptr;
  Vec_Int_t *pVVar6;
  FILE *pFVar7;
  abctime aVar8;
  uint uVar9;
  int iVar10;
  uint *Sign;
  ulong uVar11;
  uint uTruth;
  int Counter;
  uint *local_40;
  int *pCounter;
  
  Abc_Clock();
  psVar5 = stmm_init_gen(s_pManRwrExp5_body);
  uVar9 = 0;
  uVar4 = 0;
  while (iVar2 = stmm_gen(psVar5,(char **)&uTruth,(char **)&Counter), iVar2 != 0) {
    uVar9 = uVar9 + Counter;
    if ((int)uVar4 <= Counter) {
      uVar4 = Counter;
    }
  }
  stmm_free_gen(psVar5);
  printf("Number of cuts considered       = %8d.\n",(ulong)uVar9);
  printf("Classes occurring at least once = %8d.\n",(ulong)(uint)s_pManRwrExp5_body->num_entries);
  printf("The largest number of occurence = %8d.\n",(ulong)uVar4);
  __size = (ulong)uVar4 * 4 + 4;
  uVar11 = 1;
  __ptr = calloc(1,__size);
  local_40 = (uint *)malloc(__size);
  psVar5 = stmm_init_gen(s_pManRwrExp5_body);
  while( true ) {
    iVar2 = stmm_gen(psVar5,(char **)&uTruth,(char **)&Counter);
    if (iVar2 == 0) {
      stmm_free_gen(psVar5);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      Sign = local_40;
      for (; Sign = Sign + 1, uVar11 - uVar4 != 1; uVar11 = uVar11 + 1) {
        if (*(int *)((long)__ptr + uVar11 * 4) != 0) {
          printf("Occurence = %6d.  Num classes = %4d.  Repr = ",uVar11 & 0xffffffff);
          Extra_PrintBinary(_stdout,Sign,0x20);
          putchar(10);
        }
      }
      free(__ptr);
      free(local_40);
      pVVar6 = Vec_IntAlloc(s_pManRwrExp5_body->num_entries);
      psVar5 = stmm_init_gen(s_pManRwrExp5_body);
      while (iVar2 = stmm_gen(psVar5,(char **)&uTruth,(char **)0x0), iVar2 != 0) {
        Vec_IntPush(pVVar6,uTruth);
      }
      stmm_free_gen(psVar5);
      Vec_IntSortUnsigned(pVVar6);
      pFVar7 = fopen("nnclass_stats5.txt","w");
      iVar2 = pVVar6->nSize;
      local_40 = (uint *)CONCAT44(local_40._4_4_,iVar2);
      iVar10 = 0;
      if (0 < iVar2) {
        iVar10 = iVar2;
      }
      iVar2 = 0;
      while( true ) {
        if (iVar10 == iVar2) {
          fclose(pFVar7);
          iVar2 = 0;
          printf("%d classes written into file \"%s\".\n",(ulong)local_40 & 0xffffffff,
                 "nnclass_stats5.txt");
          local_40 = (uint *)Abc_Clock();
          while( true ) {
            if (iVar10 == iVar2) {
              iVar2 = 0x747f83;
              printf("The numbe of NPN classes = %d.\n",(ulong)(uint)DAT_00ad14e8->num_entries);
              Abc_Print(iVar2,"%s =","Computing NPN classes");
              aVar8 = Abc_Clock();
              Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar8 - (long)local_40) / 1000000.0);
              pVVar6 = Vec_IntAlloc(DAT_00ad14e8->num_entries);
              psVar5 = stmm_init_gen(DAT_00ad14e8);
              while (iVar2 = stmm_gen(psVar5,(char **)&uTruth,(char **)0x0), iVar2 != 0) {
                Vec_IntPush(pVVar6,uTruth);
              }
              stmm_free_gen(psVar5);
              Vec_IntSortUnsigned(pVVar6);
              pFVar7 = fopen("npnclass_stats5.txt","w");
              iVar2 = pVVar6->nSize;
              local_40 = (uint *)CONCAT44(local_40._4_4_,iVar2);
              iVar10 = 0;
              if (0 < iVar2) {
                iVar10 = iVar2;
              }
              iVar2 = 0;
              while( true ) {
                if (iVar10 == iVar2) {
                  fclose(pFVar7);
                  printf("%d classes written into file \"%s\".\n",(ulong)local_40 & 0xffffffff,
                         "npnclass_stats5.txt");
                  return;
                }
                uTruth = Vec_IntEntry(pVVar6,iVar2);
                iVar3 = stmm_lookup(DAT_00ad14e8,(char *)(ulong)uTruth,(char **)&Counter);
                if (iVar3 == 0) break;
                Extra_PrintHex((FILE *)pFVar7,&uTruth,5);
                fprintf(pFVar7," %10d\n",(ulong)(uint)Counter);
                iVar2 = iVar2 + 1;
              }
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                            ,0x13d,"void Rwt_Man5ExplorePrint()");
            }
            uTruth = Vec_IntEntry(pVVar6,iVar2);
            uVar4 = Extra_TruthCanonNPN(uTruth,5);
            iVar3 = stmm_find_or_add(DAT_00ad14e8,(char *)(ulong)uVar4,(char ***)&pCounter);
            if (iVar3 == 0) {
              *pCounter = 0;
            }
            iVar3 = stmm_lookup(s_pManRwrExp5_body,(char *)(ulong)uTruth,(char **)&Counter);
            if (iVar3 == 0) break;
            *pCounter = *pCounter + Counter;
            iVar2 = iVar2 + 1;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                        ,0x12a,"void Rwt_Man5ExplorePrint()");
        }
        uTruth = Vec_IntEntry(pVVar6,iVar2);
        iVar3 = stmm_lookup(s_pManRwrExp5_body,(char *)(ulong)uTruth,(char **)&Counter);
        if (iVar3 == 0) break;
        Extra_PrintHex((FILE *)pFVar7,&uTruth,5);
        fprintf(pFVar7," %10d\n",(ulong)(uint)Counter);
        iVar2 = iVar2 + 1;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                    ,0x117,"void Rwt_Man5ExplorePrint()");
    }
    if ((int)uVar4 < Counter) break;
    piVar1 = (int *)((long)__ptr + (long)Counter * 4);
    *piVar1 = *piVar1 + 1;
    local_40[Counter] = uTruth;
  }
  __assert_fail("Counter <= CountMax",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                ,0xfb,"void Rwt_Man5ExplorePrint()");
}

Assistant:

void Rwt_Man5ExplorePrint()
{
    FILE * pFile;
    stmm_generator * gen;
    int i, CountMax, nCuts, Counter;
    int * pDistrib;
    unsigned * pReprs;
    unsigned uTruth, uTruthC;
    abctime clk = Abc_Clock();
    Vec_Int_t * vClassesNN, * vClassesNPN;

    // find the max number of occurences
    nCuts = 0;
    CountMax = 0;
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, (char **)&Counter )
    {
        nCuts += Counter;
        if ( CountMax < Counter )
            CountMax = Counter;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", stmm_count(s_pManRwrExp5->tTableNN) );
    printf( "The largest number of occurence = %8d.\n", CountMax );

    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( unsigned, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, (char **)&Counter )
    {
        assert( Counter <= CountMax );
        pDistrib[ Counter ]++;
        pReprs[ Counter ] = uTruth;
    }

    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, pReprs + i, 32 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );


    // put them into an array
    vClassesNN = Vec_IntAlloc( stmm_count(s_pManRwrExp5->tTableNN) );
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, NULL )
        Vec_IntPush( vClassesNN, (int)uTruth );
    Vec_IntSortUnsigned( vClassesNN );

    // write into a file all classes
    pFile = fopen( "nnclass_stats5.txt", "w" );
    Vec_IntForEachEntry( vClassesNN, uTruth, i )
    {
        if ( !stmm_lookup( s_pManRwrExp5->tTableNN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        Extra_PrintHex( pFile, &uTruth, 5 );
        fprintf( pFile, " %10d\n", Counter );
    }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", vClassesNN->nSize, "nnclass_stats5.txt" );


clk = Abc_Clock();
    // how many NPN classes exist?
    Vec_IntForEachEntry( vClassesNN, uTruth, i )
    {
        int * pCounter;
        uTruthC = Extra_TruthCanonNPN( uTruth, 5 );
        if ( !stmm_find_or_add( s_pManRwrExp5->tTableNPN, (char *)(ABC_PTRUINT_T)uTruthC, (char***)&pCounter ) )
            *pCounter = 0;
        if ( !stmm_lookup( s_pManRwrExp5->tTableNN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        (*pCounter) += Counter;
    }
    printf( "The numbe of NPN classes = %d.\n", stmm_count(s_pManRwrExp5->tTableNPN) );
ABC_PRT( "Computing NPN classes", Abc_Clock() - clk );

    // put them into an array
    vClassesNPN = Vec_IntAlloc( stmm_count(s_pManRwrExp5->tTableNPN) );
    stmm_foreach_item( s_pManRwrExp5->tTableNPN, gen, (char **)&uTruth, NULL )
        Vec_IntPush( vClassesNPN, (int)uTruth );
    Vec_IntSortUnsigned( vClassesNPN );

    // write into a file all classes
    pFile = fopen( "npnclass_stats5.txt", "w" );
    Vec_IntForEachEntry( vClassesNPN, uTruth, i )
    {
        if ( !stmm_lookup( s_pManRwrExp5->tTableNPN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        Extra_PrintHex( pFile, &uTruth, 5 );
        fprintf( pFile, " %10d\n", Counter );
    }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", vClassesNPN->nSize, "npnclass_stats5.txt" );


    // can they be uniquely characterized?

}